

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUMPU9150.cpp
# Opt level: O0

bool __thiscall RTIMUMPU9150::setLpf(RTIMUMPU9150 *this,uchar lpf)

{
  uchar lpf_local;
  RTIMUMPU9150 *this_local;
  
  if (6 < lpf) {
    fprintf(_stderr,"Illegal MPU9150 lpf %d\n",(ulong)lpf);
  }
  else {
    this->m_lpf = lpf;
  }
  this_local._7_1_ = 6 >= lpf;
  return this_local._7_1_;
}

Assistant:

bool RTIMUMPU9150::setLpf(unsigned char lpf)
{
    switch (lpf) {
    case MPU9150_LPF_256:
    case MPU9150_LPF_188:
    case MPU9150_LPF_98:
    case MPU9150_LPF_42:
    case MPU9150_LPF_20:
    case MPU9150_LPF_10:
    case MPU9150_LPF_5:
        m_lpf = lpf;
        return true;

    default:
        HAL_ERROR1("Illegal MPU9150 lpf %d\n", lpf);
        return false;
    }
}